

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O2

void __thiscall CMU462::Application::mouse_moved(Application *this,float x,float y)

{
  int iVar1;
  double dVar2;
  bool transformed;
  bool getElement;
  Scene *this_00;
  Vector2D local_18;
  
  dVar2 = (double)((float)this->screenH - y);
  local_18.y._0_4_ = SUB84(dVar2,0);
  local_18.x = (double)x;
  local_18.y._4_4_ = (int)((ulong)dVar2 >> 0x20);
  update_gl_camera(this);
  iVar1 = *(int *)&(this->super_Renderer).field_0xc;
  if (iVar1 == 2) {
    this_00 = this->scene;
    transformed = true;
    getElement = transformed;
    if (this->action != Wave) {
      getElement = false;
    }
  }
  else {
    if (iVar1 != 0) {
      return;
    }
    this_00 = this->scene;
    transformed = false;
    getElement = true;
  }
  DynamicScene::Scene::getHoveredObject(this_00,&local_18,getElement,transformed);
  return;
}

Assistant:

void Application::mouse_moved(float x, float y) {
  y = screenH - y; // Because up is down.
  // Converts x from [0, w] to [-1, 1], and similarly for y.
  //Vector2D p(x * 2 / screenW - 1, y * 2 / screenH - 1);
  Vector2D p(x,y);
  update_gl_camera();
  if (mode == MODEL_MODE) {
    scene->getHoveredObject(p);
  }
  else if (mode == ANIMATE_MODE) {
    if (action == Action::Wave) {
      scene->getHoveredObject(p, true, true);
    } else {
      scene->getHoveredObject(p, false, true);
    }
  }
}